

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * rbuObjIterGetWhere(sqlite3rbu *p,RbuObjIter *pIter)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  
  iVar1 = pIter->eType;
  if ((iVar1 != 1) && (iVar1 != 5)) {
    if (iVar1 != 3) {
      iVar1 = pIter->nTblCol;
      if (iVar1 < 1) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar3 = "";
        lVar5 = 0;
        pcVar2 = (char *)0x0;
        do {
          if (pIter->abTblPk[lVar5] != '\0') {
            pcVar2 = rbuMPrintf(p,"%z%s\"%w\"=?%d",pcVar2,pcVar3,pIter->azTblCol[lVar5],
                                lVar5 + 1U & 0xffffffff);
            iVar1 = pIter->nTblCol;
            pcVar3 = " AND ";
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar1);
      }
      return pcVar2;
    }
    iVar1 = pIter->nTblCol;
    if (iVar1 < 1) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar3 = "";
      uVar4 = 0;
      pcVar2 = (char *)0x0;
      do {
        if (pIter->abTblPk[uVar4] != '\0') {
          pcVar2 = rbuMPrintf(p,"%z%sc%d=?%d",pcVar2,pcVar3,uVar4 & 0xffffffff,
                              (ulong)((int)uVar4 + 1));
          iVar1 = pIter->nTblCol;
          pcVar3 = " AND ";
        }
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)iVar1);
    }
    pcVar2 = rbuMPrintf(p,"_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)",pcVar2);
    return pcVar2;
  }
  pcVar2 = rbuMPrintf(p,"_rowid_ = ?%d",(ulong)(pIter->nTblCol + 1));
  return pcVar2;
}

Assistant:

static char *rbuObjIterGetWhere(
  sqlite3rbu *p, 
  RbuObjIter *pIter
){
  char *zList = 0;
  if( pIter->eType==RBU_PK_VTAB || pIter->eType==RBU_PK_NONE ){
    zList = rbuMPrintf(p, "_rowid_ = ?%d", pIter->nTblCol+1);
  }else if( pIter->eType==RBU_PK_EXTERNAL ){
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        zList = rbuMPrintf(p, "%z%sc%d=?%d", zList, zSep, i, i+1);
        zSep = " AND ";
      }
    }
    zList = rbuMPrintf(p, 
        "_rowid_ = (SELECT id FROM rbu_imposter2 WHERE %z)", zList
    );

  }else{
    const char *zSep = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abTblPk[i] ){
        const char *zCol = pIter->azTblCol[i];
        zList = rbuMPrintf(p, "%z%s\"%w\"=?%d", zList, zSep, zCol, i+1);
        zSep = " AND ";
      }
    }
  }
  return zList;
}